

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

void __thiscall Matrix<double>::initialize(Matrix<double> *this,double beg,double end)

{
  int iVar1;
  time_t tVar2;
  ulong uVar3;
  ulong uVar4;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  if ((this->m_shape).n_row != 0) {
    uVar4 = 0;
    do {
      if ((this->m_shape).n_col != 0) {
        uVar3 = 0;
        do {
          iVar1 = rand();
          *(double *)
           (*(long *)&(this->m_elems).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar3 * 8) =
               ((double)iVar1 / 2147483647.0) * (end - beg) + beg;
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->m_shape).n_col);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->m_shape).n_row);
  }
  return;
}

Assistant:

void Matrix<T>::initialize(T beg, T end){
    srand(time(0));

    for(unsigned i=0;i<m_shape.n_row;++i){
        for(unsigned j=0;j<m_shape.n_col;++j)
            m_elems[i][j]=get_random<T>(beg, end);
    }
}